

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

void __thiscall TestStream::seek(TestStream *this,int32_t pos,SeekType type)

{
  int iVar1;
  
  if (type == FromCurrent) {
    pos = pos + this->m_pos;
    if (pos < 0) {
      pos = pos + this->m_size;
    }
    goto LAB_00114e80;
  }
  if (pos < 1 || type != FromEnd) {
    if (pos < 0 && type == FromEnd) {
      pos = -pos;
      goto LAB_00114e80;
    }
    if (type != FromBeginning || -1 < pos) goto LAB_00114e80;
  }
  pos = this->m_size - pos;
LAB_00114e80:
  iVar1 = this->m_size;
  if (pos < this->m_size) {
    iVar1 = pos;
  }
  this->m_pos = iVar1;
  return;
}

Assistant:

void
TestStream::seek( int32_t pos, Excel::Stream::SeekType type )
{
	if( type == Excel::Stream::FromCurrent )
	{
		pos += m_pos;

		if( pos < 0 )
			pos += m_size;
	}
	else if( type == Excel::Stream::FromEnd && pos > 0 )
		pos = m_size - pos;
	else if( type == Excel::Stream::FromEnd && pos < 0 )
		pos = std::abs( pos );
	else if( type == Excel::Stream::FromBeginning && pos < 0 )
		pos = m_size - pos;

	if( pos >= m_size )
	{
		m_pos = m_size;
		return;
	}

	m_pos = pos;
}